

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classic_Emu.cpp
# Opt level: O2

blargg_err_t __thiscall Classic_Emu::set_sample_rate_(Classic_Emu *this,long rate)

{
  int iVar1;
  Stereo_Buffer *this_00;
  undefined4 extraout_var;
  
  this_00 = (Stereo_Buffer *)this->buf;
  if (this_00 == (Stereo_Buffer *)0x0) {
    this_00 = (Stereo_Buffer *)this->stereo_buffer;
    if (this_00 == (Stereo_Buffer *)0x0) {
      this_00 = (Stereo_Buffer *)malloc(0x100);
      if (this_00 == (Stereo_Buffer *)0x0) {
        this->stereo_buffer = (Multi_Buffer *)0x0;
        return "Out of memory";
      }
      Stereo_Buffer::Stereo_Buffer(this_00);
      this->stereo_buffer = (Multi_Buffer *)this_00;
    }
    this->buf = &this_00->super_Multi_Buffer;
  }
  iVar1 = (*(this_00->super_Multi_Buffer)._vptr_Multi_Buffer[4])(this_00,rate,0x32);
  return (blargg_err_t)CONCAT44(extraout_var,iVar1);
}

Assistant:

blargg_err_t Classic_Emu::set_sample_rate_( long rate )
{
	if ( !buf )
	{
		if ( !stereo_buffer )
			CHECK_ALLOC( stereo_buffer = BLARGG_NEW Stereo_Buffer );
		buf = stereo_buffer;
	}
	return buf->set_sample_rate( rate, 1000 / 20 );
}